

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O0

int Min_CubeCountLits(Min_Cube_t *pCube)

{
  int local_20;
  int local_1c;
  int w;
  int i;
  int Count;
  uint uData;
  Min_Cube_t *pCube_local;
  
  w = 0;
  for (local_20 = 0; local_20 < (int)(*(uint *)&pCube->field_0x8 >> 10 & 0xfff);
      local_20 = local_20 + 1) {
    for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 2) {
      if (((pCube->uData[local_20] ^ pCube->uData[local_20] >> 1) & 1 << ((byte)local_1c & 0x1f)) !=
          0) {
        w = w + 1;
      }
    }
  }
  return w;
}

Assistant:

static inline int Min_CubeCountLits( Min_Cube_t * pCube )
{
    unsigned uData;
    int Count = 0, i, w;
    for ( w = 0; w < (int)pCube->nWords; w++ )
    {
        uData = pCube->uData[w] ^ (pCube->uData[w] >> 1);
        for ( i = 0; i < 32; i += 2 )
            if ( uData & (1 << i) )
                Count++;
    }
    return Count;
}